

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O1

rangelist_entries * __thiscall
cpptrace::detail::libdwarf::die_object::get_rangelist_entries
          (rangelist_entries *__return_storage_ptr__,die_object *this,die_object *cu_die,int version
          )

{
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dwarf_ranges<cpptrace::detail::libdwarf::die_object::get_rangelist_entries(cpptrace::detail::libdwarf::die_object_const&,int)const::_lambda(unsigned_long_long,unsigned_long_long)_1_>
            (this,cu_die,version,(anon_class_8_1_ba1d82f4)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

rangelist_entries get_rangelist_entries(const die_object& cu_die, int version) const {
            rangelist_entries vec;
            dwarf_ranges(cu_die, version, [&vec] (Dwarf_Addr low, Dwarf_Addr high) {
                // Simple coalescing optimization:
                // Sometimes the range list entries are really continuous: [100, 200), [200, 300)
                // Other times there's just one byte of separation [300, 399), [400, 500)
                // Those are the main two cases I've observed.
                // This will not catch all cases, presumably, as the range lists aren't sorted. But compilers/linkers
                // seem to like to emit the ranges in sorted order.
                if(!vec.empty() && low - vec.back().second <= 1) {
                    vec.back().second = high;
                } else {
                    vec.push_back({low, high});
                }
                return true;
            });
            return vec;
        }